

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovalsTests.cpp
# Opt level: O1

void __thiscall
GoogleTestApprovalsTests_TestStreamableObject_Test::TestBody
          (GoogleTestApprovalsTests_TestStreamableObject_Test *this)

{
  int local_7c;
  Options local_78;
  
  local_7c = 0x2a;
  local_78.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_78.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.scrubber_._M_invoker = (_Invoker_type)0x0;
  local_78.reporter_ = (Reporter *)0x0;
  local_78.scrubber_.super__Function_base._M_functor._8_8_ = 0;
  local_78.scrubber_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78.fileOptions_.fileExtensionWithDot_.field_2._8_8_ = 0;
  local_78.scrubber_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.fileOptions_.fileExtensionWithDot_._M_string_length = 0;
  local_78.fileOptions_.fileExtensionWithDot_.field_2._M_allocated_capacity = 0;
  local_78.fileOptions_.options_ = (Options *)0x0;
  local_78.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p = (pointer)0x0;
  local_78.usingDefaultScrubber_ = false;
  local_78._97_7_ = 0;
  ApprovalTests::Options::Options(&local_78);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<int,int>(&local_7c,&local_78);
  if (local_78.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.namer_.
               super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.scrubber_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.scrubber_.super__Function_base._M_manager)
              ((_Any_data *)&local_78.scrubber_,(_Any_data *)&local_78.scrubber_,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p !=
      &local_78.fileOptions_.fileExtensionWithDot_.field_2) {
    operator_delete(local_78.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(GoogleTestApprovalsTests, TestStreamableObject)
{
    Approvals::verify(42);
}